

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmac.c
# Opt level: O1

int mbedtls_cmac_self_test(int verbose)

{
  int in_EAX;
  int iVar1;
  int unaff_EBX;
  int in_stack_ffffffffffffffe0;
  int iVar2;
  
  iVar1 = cmac_test_subkeys(verbose,"AES 128",aes_128_key,0x80,aes_128_subkeys[0],
                            MBEDTLS_CIPHER_AES_128_ECB,0x10,in_stack_ffffffffffffffe0);
  if (iVar1 == 0) {
    iVar2 = 0x10;
    iVar1 = cmac_test_wth_cipher
                      (verbose,"AES 128",aes_128_key,0x80,(uchar *)aes_message_lengths,
                       (uint *)aes_128_expected_result,(uchar *)0x2,MBEDTLS_CIPHER_AES_256_GCM,
                       in_EAX,unaff_EBX);
    if ((iVar1 == 0) &&
       (iVar1 = cmac_test_subkeys(verbose,"AES 192",aes_192_key,0xc0,aes_192_subkeys[0],
                                  MBEDTLS_CIPHER_AES_192_ECB,0x10,iVar2), iVar1 == 0)) {
      iVar2 = 0x10;
      iVar1 = cmac_test_wth_cipher
                        (verbose,"AES 192",aes_192_key,0xc0,(uchar *)aes_message_lengths,
                         (uint *)aes_192_expected_result,(uchar *)0x3,MBEDTLS_CIPHER_AES_256_GCM,
                         in_EAX,unaff_EBX);
      if ((iVar1 == 0) &&
         (iVar1 = cmac_test_subkeys(verbose,"AES 256",aes_256_key,0x100,aes_256_subkeys[0],
                                    MBEDTLS_CIPHER_AES_256_ECB,0x10,iVar2), iVar1 == 0)) {
        iVar2 = 0x10;
        iVar1 = cmac_test_wth_cipher
                          (verbose,"AES 256",aes_256_key,0x100,(uchar *)aes_message_lengths,
                           (uint *)aes_256_expected_result,(uchar *)0x4,MBEDTLS_CIPHER_AES_256_GCM,
                           in_EAX,unaff_EBX);
        if ((iVar1 == 0) &&
           (iVar1 = cmac_test_subkeys(verbose,"3DES 2 key",des3_2key_key,0xc0,des3_2key_subkeys[0],
                                      MBEDTLS_CIPHER_DES_EDE3_ECB,8,iVar2), iVar1 == 0)) {
          iVar2 = 8;
          iVar1 = cmac_test_wth_cipher
                            (verbose,"3DES 2 key",des3_2key_key,0xc0,(uchar *)des3_message_lengths,
                             (uint *)des3_2key_expected_result,(uchar *)0x24,
                             MBEDTLS_CIPHER_AES_128_CFB128,in_EAX,unaff_EBX);
          if ((iVar1 == 0) &&
             ((((iVar1 = cmac_test_subkeys(verbose,"3DES 3 key",des3_3key_key,0xc0,
                                           des3_3key_subkeys[0],MBEDTLS_CIPHER_DES_EDE3_ECB,8,iVar2)
                , iVar1 == 0 &&
                (iVar1 = cmac_test_wth_cipher
                                   (verbose,"3DES 3 key",des3_3key_key,0xc0,
                                    (uchar *)des3_message_lengths,(uint *)des3_3key_expected_result,
                                    (uchar *)0x24,MBEDTLS_CIPHER_AES_128_CFB128,in_EAX,unaff_EBX),
                iVar1 == 0)) && (iVar1 = test_aes128_cmac_prf(verbose), iVar1 == 0)) &&
              (iVar1 = 0, verbose != 0)))) {
            putchar(10);
          }
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_cmac_self_test( int verbose )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

#if defined(MBEDTLS_AES_C)
    /* AES-128 */
    if( ( ret = cmac_test_subkeys( verbose,
                                   "AES 128",
                                   aes_128_key,
                                   128,
                                   (const unsigned char*)aes_128_subkeys,
                                   MBEDTLS_CIPHER_AES_128_ECB,
                                   MBEDTLS_AES_BLOCK_SIZE,
                                   NB_CMAC_TESTS_PER_KEY ) ) != 0 )
    {
        return( ret );
    }

    if( ( ret = cmac_test_wth_cipher( verbose,
                                      "AES 128",
                                      aes_128_key,
                                      128,
                                      test_message,
                                      aes_message_lengths,
                                      (const unsigned char*)aes_128_expected_result,
                                      MBEDTLS_CIPHER_AES_128_ECB,
                                      MBEDTLS_AES_BLOCK_SIZE,
                                      NB_CMAC_TESTS_PER_KEY ) ) != 0 )
    {
        return( ret );
    }

    /* AES-192 */
    if( ( ret = cmac_test_subkeys( verbose,
                                   "AES 192",
                                   aes_192_key,
                                   192,
                                   (const unsigned char*)aes_192_subkeys,
                                   MBEDTLS_CIPHER_AES_192_ECB,
                                   MBEDTLS_AES_BLOCK_SIZE,
                                   NB_CMAC_TESTS_PER_KEY ) ) != 0 )
    {
        return( ret );
    }

    if( ( ret = cmac_test_wth_cipher( verbose,
                                      "AES 192",
                                      aes_192_key,
                                      192,
                                      test_message,
                                      aes_message_lengths,
                                      (const unsigned char*)aes_192_expected_result,
                                      MBEDTLS_CIPHER_AES_192_ECB,
                                      MBEDTLS_AES_BLOCK_SIZE,
                                      NB_CMAC_TESTS_PER_KEY ) ) != 0 )
    {
        return( ret );
    }

    /* AES-256 */
    if( ( ret = cmac_test_subkeys( verbose,
                                   "AES 256",
                                   aes_256_key,
                                   256,
                                   (const unsigned char*)aes_256_subkeys,
                                   MBEDTLS_CIPHER_AES_256_ECB,
                                   MBEDTLS_AES_BLOCK_SIZE,
                                   NB_CMAC_TESTS_PER_KEY ) ) != 0 )
    {
        return( ret );
    }

    if( ( ret = cmac_test_wth_cipher ( verbose,
                                       "AES 256",
                                       aes_256_key,
                                       256,
                                       test_message,
                                       aes_message_lengths,
                                       (const unsigned char*)aes_256_expected_result,
                                       MBEDTLS_CIPHER_AES_256_ECB,
                                       MBEDTLS_AES_BLOCK_SIZE,
                                       NB_CMAC_TESTS_PER_KEY ) ) != 0 )
    {
        return( ret );
    }
#endif /* MBEDTLS_AES_C */

#if defined(MBEDTLS_DES_C)
    /* 3DES 2 key */
    if( ( ret = cmac_test_subkeys( verbose,
                                   "3DES 2 key",
                                   des3_2key_key,
                                   192,
                                   (const unsigned char*)des3_2key_subkeys,
                                   MBEDTLS_CIPHER_DES_EDE3_ECB,
                                   MBEDTLS_DES3_BLOCK_SIZE,
                                   NB_CMAC_TESTS_PER_KEY ) ) != 0 )
    {
        return( ret );
    }

    if( ( ret = cmac_test_wth_cipher( verbose,
                                      "3DES 2 key",
                                      des3_2key_key,
                                      192,
                                      test_message,
                                      des3_message_lengths,
                                      (const unsigned char*)des3_2key_expected_result,
                                      MBEDTLS_CIPHER_DES_EDE3_ECB,
                                      MBEDTLS_DES3_BLOCK_SIZE,
                                      NB_CMAC_TESTS_PER_KEY ) ) != 0 )
    {
        return( ret );
    }

    /* 3DES 3 key */
    if( ( ret = cmac_test_subkeys( verbose,
                                   "3DES 3 key",
                                   des3_3key_key,
                                   192,
                                   (const unsigned char*)des3_3key_subkeys,
                                   MBEDTLS_CIPHER_DES_EDE3_ECB,
                                   MBEDTLS_DES3_BLOCK_SIZE,
                                   NB_CMAC_TESTS_PER_KEY ) ) != 0 )
    {
        return( ret );
    }

    if( ( ret = cmac_test_wth_cipher( verbose,
                                      "3DES 3 key",
                                      des3_3key_key,
                                      192,
                                      test_message,
                                      des3_message_lengths,
                                      (const unsigned char*)des3_3key_expected_result,
                                      MBEDTLS_CIPHER_DES_EDE3_ECB,
                                      MBEDTLS_DES3_BLOCK_SIZE,
                                      NB_CMAC_TESTS_PER_KEY ) ) != 0 )
    {
        return( ret );
    }
#endif /* MBEDTLS_DES_C */

#if defined(MBEDTLS_AES_C)
    if( ( ret = test_aes128_cmac_prf( verbose ) ) != 0 )
        return( ret );
#endif /* MBEDTLS_AES_C */

    if( verbose != 0 )
        mbedtls_printf( "\n" );

    return( 0 );
}